

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O1

int do_handshake(mbedtls_ssl_context *ssl)

{
  uint ret;
  uint32_t flags;
  char *pcVar1;
  mbedtls_x509_crt *crt;
  uchar buf [1024];
  char vrfy_buf [512];
  char acStack_618 [1024];
  char local_218 [512];
  
  memset(acStack_618,0,0x400);
  printf("  . Performing the SSL/TLS handshake...");
  fflush(_stdout);
  do {
    ret = mbedtls_ssl_handshake(ssl);
    if (ret == 0) {
      pcVar1 = mbedtls_ssl_get_ciphersuite(ssl);
      printf(" ok\n    [ Ciphersuite is %s ]\n",pcVar1);
      printf("  . Verifying peer X.509 certificate...");
      flags = mbedtls_ssl_get_verify_result(ssl);
      if (flags == 0) {
        pcVar1 = " ok";
      }
      else {
        puts(" failed");
        pcVar1 = local_218;
        mbedtls_x509_crt_verify_info(pcVar1,0x200,"  ! ",flags);
      }
      puts(pcVar1);
      puts("  . Peer certificate information    ...");
      crt = mbedtls_ssl_get_peer_cert(ssl);
      mbedtls_x509_crt_info(acStack_618,0x3ff,"      ",crt);
      puts(acStack_618);
      return 0;
    }
  } while ((ret & 0xffffff7f) == 0xffff9700);
  mbedtls_strerror(ret,acStack_618,0x400);
  printf(" failed\n  ! mbedtls_ssl_handshake returned %d: %s\n\n",(ulong)ret,acStack_618);
  return -1;
}

Assistant:

static int do_handshake( mbedtls_ssl_context *ssl )
{
    int ret;
    uint32_t flags;
    unsigned char buf[1024];
    memset(buf, 0, 1024);

    /*
     * 4. Handshake
     */
    mbedtls_printf( "  . Performing the SSL/TLS handshake..." );
    fflush( stdout );

    while( ( ret = mbedtls_ssl_handshake( ssl ) ) != 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
#if defined(MBEDTLS_ERROR_C)
            mbedtls_strerror( ret, (char *) buf, 1024 );
#endif
            mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned %d: %s\n\n", ret, buf );
            return( -1 );
        }
    }

    mbedtls_printf( " ok\n    [ Ciphersuite is %s ]\n",
            mbedtls_ssl_get_ciphersuite( ssl ) );

    /*
     * 5. Verify the server certificate
     */
    mbedtls_printf( "  . Verifying peer X.509 certificate..." );

    /* In real life, we probably want to bail out when ret != 0 */
    if( ( flags = mbedtls_ssl_get_verify_result( ssl ) ) != 0 )
    {
        char vrfy_buf[512];

        mbedtls_printf( " failed\n" );

        mbedtls_x509_crt_verify_info( vrfy_buf, sizeof( vrfy_buf ), "  ! ", flags );

        mbedtls_printf( "%s\n", vrfy_buf );
    }
    else
        mbedtls_printf( " ok\n" );

    mbedtls_printf( "  . Peer certificate information    ...\n" );
    mbedtls_x509_crt_info( (char *) buf, sizeof( buf ) - 1, "      ",
                   mbedtls_ssl_get_peer_cert( ssl ) );
    mbedtls_printf( "%s\n", buf );

    return( 0 );
}